

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

void Saig_AndDualRail(Aig_Man_t *pNew,Aig_Obj_t *pObj,Aig_Obj_t **ppData,Aig_Obj_t **ppNext)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *local_78;
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_60;
  Aig_Obj_t *p1Next;
  Aig_Obj_t *p1Data;
  Aig_Obj_t *p0Next;
  Aig_Obj_t *p0Data;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t **ppNext_local;
  Aig_Obj_t **ppData_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pNew_local;
  
  pAVar2 = Aig_ObjFanin0(pObj);
  pAVar3 = Aig_ObjFanin1(pObj);
  iVar1 = Aig_ObjFaninC0(pObj);
  if (iVar1 == 0) {
    local_60 = (Aig_Obj_t *)(pAVar2->field_5).pData;
  }
  else {
    local_60 = (pAVar2->field_0).pNext;
  }
  iVar1 = Aig_ObjFaninC0(pObj);
  if (iVar1 == 0) {
    local_68 = (pAVar2->field_0).pNext;
  }
  else {
    local_68 = (Aig_Obj_t *)(pAVar2->field_5).pData;
  }
  iVar1 = Aig_ObjFaninC1(pObj);
  if (iVar1 == 0) {
    local_70 = (Aig_Obj_t *)(pAVar3->field_5).pData;
  }
  else {
    local_70 = (pAVar3->field_0).pNext;
  }
  iVar1 = Aig_ObjFaninC1(pObj);
  if (iVar1 == 0) {
    local_78 = (pAVar3->field_0).pNext;
  }
  else {
    local_78 = (Aig_Obj_t *)(pAVar3->field_5).pData;
  }
  pAVar2 = Aig_Not(local_68);
  pAVar2 = Aig_And(pNew,local_60,pAVar2);
  pAVar3 = Aig_Not(local_78);
  pAVar3 = Aig_And(pNew,local_70,pAVar3);
  pAVar2 = Aig_Or(pNew,pAVar2,pAVar3);
  *ppData = pAVar2;
  pAVar2 = Aig_Not(local_60);
  pAVar2 = Aig_And(pNew,pAVar2,local_68);
  pAVar3 = Aig_Not(local_70);
  pAVar3 = Aig_And(pNew,pAVar3,local_78);
  pAVar2 = Aig_And(pNew,pAVar2,pAVar3);
  *ppNext = pAVar2;
  return;
}

Assistant:

void Saig_AndDualRail( Aig_Man_t * pNew, Aig_Obj_t * pObj, Aig_Obj_t ** ppData, Aig_Obj_t ** ppNext )
{
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    Aig_Obj_t * p0Data = Aig_ObjFaninC0(pObj)? pFanin0->pNext              : (Aig_Obj_t *)pFanin0->pData;
    Aig_Obj_t * p0Next = Aig_ObjFaninC0(pObj)? (Aig_Obj_t *)pFanin0->pData : pFanin0->pNext;
    Aig_Obj_t * p1Data = Aig_ObjFaninC1(pObj)? pFanin1->pNext              : (Aig_Obj_t *)pFanin1->pData;
    Aig_Obj_t * p1Next = Aig_ObjFaninC1(pObj)? (Aig_Obj_t *)pFanin1->pData : pFanin1->pNext;
    *ppData = Aig_Or( pNew, 
        Aig_And(pNew, p0Data, Aig_Not(p0Next)),
        Aig_And(pNew, p1Data, Aig_Not(p1Next)) );
    *ppNext = Aig_And( pNew, 
        Aig_And(pNew, Aig_Not(p0Data), p0Next),
        Aig_And(pNew, Aig_Not(p1Data), p1Next) );
}